

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::anon_unknown_5::createIndexData
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,TestConfig *config)

{
  value_type_conflict3 local_28 [6];
  int local_1c;
  TestConfig *pTStack_18;
  int triangleNdx;
  TestConfig *config_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *data_local;
  
  pTStack_18 = config;
  config_local = (TestConfig *)data;
  for (local_1c = 0; local_1c < pTStack_18->triangleCount; local_1c = local_1c + 1) {
    if (local_1c % 2 == 0) {
      local_28[5] = 0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,
                 local_28 + 5);
      local_28[4] = 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,
                 local_28 + 4);
      local_28[3] = 2;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,
                 local_28 + 3);
    }
    else {
      local_28[2] = 2;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,
                 local_28 + 2);
      local_28[1] = 3;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,
                 local_28 + 1);
      local_28[0] = 0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)config_local,local_28);
    }
  }
  return;
}

Assistant:

void createIndexData (vector<deUint16>& data, const TestConfig& config)
{
	for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
	{
		if ((triangleNdx % 2) == 0)
		{
			data.push_back(0);
			data.push_back(1);
			data.push_back(2);
		}
		else
		{
			data.push_back(2);
			data.push_back(3);
			data.push_back(0);
		}
	}
}